

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

void run_every_test(TestSuite *suite,TestReporter *reporter)

{
  _func_void_TestReporter_ptr_char_ptr_int *p_Var1;
  UnitTest *pUVar2;
  CgreenTest *test;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t end_time_in_milliseconds;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  run_specified_test_if_child(suite,reporter);
  uVar3 = cgreen_time_get_current_milliseconds();
  p_Var1 = reporter->start_suite;
  pcVar6 = suite->name;
  iVar4 = count_tests(suite);
  (*p_Var1)(reporter,pcVar6,iVar4);
  iVar4 = suite->size;
  if (0 < iVar4) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      if (*(int *)((long)&suite->tests->type + lVar8) != 0) {
        (*suite->setup)();
        run_every_test(*(TestSuite **)((long)&suite->tests->Runnable + lVar8),reporter);
        (*suite->teardown)();
        iVar4 = suite->size;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x18;
    } while (lVar7 < iVar4);
  }
  reporter->passes = 0;
  reporter->failures = 0;
  reporter->exceptions = 0;
  reporter->skips = 0;
  uVar5 = cgreen_time_get_current_milliseconds();
  if (0 < suite->size) {
    lVar8 = 0x10;
    lVar7 = 0;
    do {
      pUVar2 = suite->tests;
      if (*(int *)((long)pUVar2 + lVar8 + -0x10) == 0) {
        pcVar6 = getenv("CGREEN_NO_FORK");
        test = *(CgreenTest **)((long)&pUVar2->type + lVar8);
        if (pcVar6 == (char *)0x0) {
          run_test_in_its_own_process(suite,test,reporter);
        }
        else {
          run_test_in_the_current_process(suite,test,reporter);
        }
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x18;
    } while (lVar7 < suite->size);
  }
  end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
  uVar5 = cgreen_time_duration_in_milliseconds(uVar5,end_time_in_milliseconds);
  reporter->duration = uVar5;
  uVar5 = cgreen_time_get_current_milliseconds();
  uVar3 = cgreen_time_duration_in_milliseconds(uVar3,uVar5);
  reporter->total_duration = uVar3;
  send_reporter_completion_notification(reporter);
  (*reporter->finish_suite)(reporter,suite->filename,suite->line);
  return;
}

Assistant:

static void run_every_test(TestSuite *suite, TestReporter *reporter)
{
    int i;

    run_specified_test_if_child(suite, reporter);

    uint32_t total_test_starting_milliseconds = cgreen_time_get_current_milliseconds();
    (*reporter->start_suite)(reporter, suite->name, count_tests(suite));

    // Run sub-suites first
    for (i = 0; i < suite->size; i++)
    {
        if (suite->tests[i].type != test_function)
        {
            (*suite->setup)();
            run_every_test(suite->tests[i].Runnable.suite, reporter);
            (*suite->teardown)();
        }
    }

    // Reset counters for top-level tests
    reporter->passes = 0;
    reporter->failures = 0;
    reporter->skips = 0;
    reporter->exceptions = 0;

    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    // Run top-level tests
    for (i = 0; i < suite->size; i++)
    {
        if (suite->tests[i].type == test_function)
        {
            if (getenv("CGREEN_NO_FORK") == NULL)
                run_test_in_its_own_process(suite, suite->tests[i].Runnable.test, reporter);
            else
                run_test_in_the_current_process(suite, suite->tests[i].Runnable.test, reporter);
        }
    }

    reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                              cgreen_time_get_current_milliseconds());
    reporter->total_duration = cgreen_time_duration_in_milliseconds(total_test_starting_milliseconds,
                                                                    cgreen_time_get_current_milliseconds());
    send_reporter_completion_notification(reporter);
    (*reporter->finish_suite)(reporter, suite->filename, suite->line);
}